

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O2

Result Kernel::poCompToResult(PoComp c)

{
  return *(Result *)(&DAT_00744868 + (long)(char)c * 4);
}

Assistant:

Result poCompToResult(PoComp c) {
  switch (c) {
    case PoComp::GREATER:
      return Result::GREATER;
    case PoComp::EQUAL:
      return Result::EQUAL;
    case PoComp::LESS:
      return Result::LESS;
    case PoComp::NGEQ:
    case PoComp::NLEQ:
    case PoComp::INCOMPARABLE:
      return Result::INCOMPARABLE;
    case PoComp::UNKNOWN:
      // no unknowns here
      ASSERTION_VIOLATION;
  }
  ASSERTION_VIOLATION;
}